

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string2.cpp
# Opt level: O3

int main(void)

{
  String ret_1;
  String s1;
  String s0;
  String s2;
  vector<String,_std::allocator<String>_> svec;
  String s4;
  String s3;
  String local_70;
  String local_68;
  String local_60;
  String local_58;
  String local_50;
  vector<String,_std::allocator<String>_> local_48;
  String local_28;
  String local_20;
  String local_18;
  String local_10;
  
  String::String(&local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp1----------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String(&local_68,"hello");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp2----------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String(&local_50,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp3----------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String(&local_20,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp4----------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String(&local_58,&local_68);
  String::operator=(&local_50,&local_58);
  String::~String(&local_58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp5----------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String(&local_10,&local_68);
  String::~String(&local_10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp6----------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp7----------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String(&local_18,"temporary");
  String::~String(&local_18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp8----------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String((String *)&local_48,"temporary");
  String::~String((String *)&local_48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp9----------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String(&local_28,"world");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp10---------------------",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  local_48.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<String,_std::allocator<String>_>::push_back(&local_48,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp11----------------------",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::vector<String,_std::allocator<String>_>::push_back(&local_48,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp12----------------------",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String(&local_70,"world");
  std::vector<String,_std::allocator<String>_>::emplace_back<String>(&local_48,&local_70);
  String::~String(&local_70);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp13----------------------",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  String::String(&local_70,"good job");
  std::vector<String,_std::allocator<String>_>::emplace_back<String>(&local_48,&local_70);
  String::~String(&local_70);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp14----------------------",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::vector<String,std::allocator<String>>::emplace_back<char_const(&)[14]>
            ((vector<String,std::allocator<String>> *)&local_48,(char (*) [14])"c++11 emplace");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tp15----------------------",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::vector<String,_std::allocator<String>_>::~vector(&local_48);
  String::~String(&local_28);
  String::~String(&local_20);
  String::~String(&local_50);
  String::~String(&local_68);
  String::~String(&local_60);
  return 0;
}

Assistant:

int main()
{
  String s0;
  std::cout << "tp1----------------------" << std::endl;
  String s1("hello");
  std::cout << "tp2----------------------" << std::endl;
  String s2(s0);
  std::cout << "tp3----------------------" << std::endl;
  String s3 = s1;
  std::cout << "tp4----------------------" << std::endl;
  s2 = s1;
  std::cout << "tp5----------------------" << std::endl;

  foo(s1);
  std::cout << "tp6----------------------" << std::endl;
  bar(s1);
  std::cout << "tp7----------------------" << std::endl;
  foo("temporary");
  std::cout << "tp8----------------------" << std::endl;
  bar("temporary");
  std::cout << "tp9----------------------" << std::endl;
  String s4 = baz();
  std::cout << "tp10---------------------" << std::endl;

  std::vector<String> svec;
  // void std::vector<String>::push_back(const String& __x)
  svec.push_back(s0);
  std::cout << "tp11----------------------" << std::endl;
  svec.push_back(s1);
  std::cout << "tp12----------------------" << std::endl;
  // void std::vector<String>::push_back(String&& __x)
  svec.push_back(baz());
  std::cout << "tp13----------------------" << std::endl;
  // void std::vector<String>::push_back(String&& __x)
  svec.push_back("good job");
  std::cout << "tp14----------------------" << std::endl;
  svec.emplace_back("c++11 emplace"); // Effective Modern C++ Item42
  std::cout << "tp15----------------------" << std::endl;
}